

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void * nk_tt__hheap_alloc(nk_tt__hheap *hh,nk_size size)

{
  nk_tt__hheap_chunk *pnVar1;
  int local_3c;
  nk_tt__hheap_chunk *c;
  int count;
  void *p;
  nk_size size_local;
  nk_tt__hheap *hh_local;
  
  if (hh->first_free == (void *)0x0) {
    if (hh->num_remaining_in_head_chunk == 0) {
      if (size < 0x20) {
        local_3c = 2000;
      }
      else {
        local_3c = 100;
        if (size < 0x80) {
          local_3c = 800;
        }
      }
      pnVar1 = (nk_tt__hheap_chunk *)
               (*(hh->alloc).alloc)((hh->alloc).userdata,(void *)0x0,size * (long)local_3c + 8);
      if (pnVar1 == (nk_tt__hheap_chunk *)0x0) {
        return (void *)0x0;
      }
      pnVar1->next = hh->head;
      hh->head = pnVar1;
      hh->num_remaining_in_head_chunk = local_3c;
    }
    hh->num_remaining_in_head_chunk = hh->num_remaining_in_head_chunk + -1;
    hh_local = (nk_tt__hheap *)
               ((long)&hh->head->next + size * (long)hh->num_remaining_in_head_chunk);
  }
  else {
    hh_local = (nk_tt__hheap *)hh->first_free;
    hh->first_free = (void *)(hh_local->alloc).userdata;
  }
  return hh_local;
}

Assistant:

NK_INTERN void*
nk_tt__hheap_alloc(struct nk_tt__hheap *hh, nk_size size)
{
    if (hh->first_free) {
        void *p = hh->first_free;
        hh->first_free = * (void **) p;
        return p;
    } else {
        if (hh->num_remaining_in_head_chunk == 0) {
            int count = (size < 32 ? 2000 : size < 128 ? 800 : 100);
            struct nk_tt__hheap_chunk *c = (struct nk_tt__hheap_chunk *)
                hh->alloc.alloc(hh->alloc.userdata, 0,
                sizeof(struct nk_tt__hheap_chunk) + size * (nk_size)count);
            if (c == 0) return 0;
            c->next = hh->head;
            hh->head = c;
            hh->num_remaining_in_head_chunk = count;
        }
        --hh->num_remaining_in_head_chunk;
        return (char *) (hh->head) + size * (nk_size)hh->num_remaining_in_head_chunk;
    }
}